

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_ori_16_tos(void)

{
  uint uVar1;
  
  if (m68ki_cpu.s_flag != 0) {
    uVar1 = m68ki_read_imm_16();
    m68ki_set_sr(m68ki_cpu.n_flag >> 4 & 8 | m68ki_cpu.x_flag >> 4 & 0x10 |
                 (uint)(m68ki_cpu.not_z_flag == 0) << 2 | m68ki_cpu.v_flag >> 6 & 2 |
                 m68ki_cpu.c_flag >> 8 & 1 |
                 (m68ki_cpu.s_flag | m68ki_cpu.m_flag) << 0xb |
                 uVar1 | m68ki_cpu.t1_flag | m68ki_cpu.t0_flag | m68ki_cpu.int_mask);
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_ori_16_tos(void)
{
	if(FLAG_S)
	{
		uint src = OPER_I_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_set_sr(m68ki_get_sr() | src);
		return;
	}
	m68ki_exception_privilege_violation();
}